

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_stdlib.hpp
# Opt level: O2

ModulePtr chaiscript::Std_Lib::library(void)

{
  Module *pMVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar3;
  allocator local_e9;
  shared_ptr<chaiscript::Module> local_e8;
  string local_d8;
  ModulePtr local_b8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_a8;
  ModulePtr local_98;
  ModulePtr local_88;
  ModulePtr local_78;
  ModulePtr local_68;
  ModulePtr local_58;
  ModulePtr local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::make_shared<chaiscript::Module>();
  bootstrap::Bootstrap::bootstrap((Bootstrap *)in_RDI,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_d8,"Vector",&local_e9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::
  vector_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((standard_library *)&local_e8,&local_d8,&local_58);
  Module::add(pMVar1,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_d8);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_d8,"string",&local_e9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::string_type<std::__cxx11::string>
            ((standard_library *)&local_e8,&local_d8,&local_68);
  Module::add(pMVar1,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_d8);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_d8,"Map",&local_e9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::
  map_type<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((standard_library *)&local_e8,&local_d8,&local_78);
  Module::add(pMVar1,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_d8);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_d8,"Pair",&local_e9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::pair_type<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
            ((standard_library *)&local_e8,&local_d8,&local_88);
  Module::add(pMVar1,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_d8);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_d8,"future",&local_e9);
  std::make_shared<chaiscript::Module>();
  bootstrap::standard_library::future_type<std::future<chaiscript::Boxed_Value>>
            ((standard_library *)&local_e8,&local_d8,&local_98);
  Module::add(pMVar1,&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_d8);
  ppVar2 = (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::future<chaiscript::Boxed_Value>(std::function<chaiscript::Boxed_Value()>const&),chaiscript::Std_Lib::library()::_lambda(std::function<chaiscript::Boxed_Value()>const&)_1_>,chaiscript::Std_Lib::library()::_lambda(std::function<chaiscript::Boxed_Value()>const&)_1_const&>
            ((anon_class_1_0_00000001_for_m_f *)&local_a8);
  std::__cxx11::string::string((string *)&local_38,"async",(allocator *)&local_e8);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&ppVar2->second,&local_a8,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  pMVar1 = (Module *)
           (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::make_shared<chaiscript::Module>();
  json_wrap::library((json_wrap *)&local_d8,&local_b8);
  Module::add(pMVar1,(shared_ptr<chaiscript::Module> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ppVar2 = (in_RDI->m_typeinfos).
           super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ChaiScript_Prelude::chaiscript_prelude_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppVar2[1].first.m_flags,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar3.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ModulePtr library()
      {
        using namespace bootstrap;

        ModulePtr lib = Bootstrap::bootstrap();

        lib->add(standard_library::vector_type<std::vector<Boxed_Value> >("Vector"));
        lib->add(standard_library::string_type<std::string>("string"));
        lib->add(standard_library::map_type<std::map<std::string, Boxed_Value> >("Map"));
        lib->add(standard_library::pair_type<std::pair<Boxed_Value, Boxed_Value > >("Pair"));

#ifndef CHAISCRIPT_NO_THREADS
        lib->add(standard_library::future_type<std::future<chaiscript::Boxed_Value>>("future"));
        lib->add(chaiscript::fun([](const std::function<chaiscript::Boxed_Value ()> &t_func){ return std::async(std::launch::async, t_func);}), "async");
#endif

        lib->add(json_wrap::library());

        lib->eval(ChaiScript_Prelude::chaiscript_prelude() /*, "standard prelude"*/ );

        return lib;
      }